

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::
print_typed_attr<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
          *attr,string *name,uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  value_type *v;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_00;
  size_type sVar4;
  const_reference v_00;
  uint32_t indent_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [8];
  optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_> pv;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *pTStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
  *attr_local;
  
  indent_00 = (uint32_t)name;
  local_24 = indent_00;
  pTStack_20 = attr;
  name_local = (string *)this;
  attr_local = (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
          ::authored((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                      *)name_local);
  if (bVar1) {
    pAVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
             ::metas((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                      *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    n = extraout_EDX;
    if ((((bVar1) ||
         (bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  ::is_blocked((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                *)name_local), n = extraout_EDX_00, bVar1)) ||
        (bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 ::has_value((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                              *)name_local), n = extraout_EDX_01, bVar1)) ||
       ((bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 ::is_value_empty((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                   *)name_local), n = extraout_EDX_02, bVar1 ||
        (bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 ::is_connection((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                  *)name_local), n = extraout_EDX_03, !bVar1)))) {
      pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_24,n);
      ::std::operator<<(aoStack_1a0,(string *)&local_1d0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      ::std::operator<<(aoStack_1a0,"uniform ");
      value::
      TypeTraits<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
      type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)((long)&pv.contained + 0x10));
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x10));
      bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              ::is_blocked((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                            *)name_local);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0," = None");
      }
      else {
        bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                ::is_value_empty((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                  *)name_local);
        if (!bVar1) {
          TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
          ::get_value((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                       *)local_210,
                      (TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                       *)name_local);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_210);
          if (bVar1) {
            poVar3 = ::std::operator<<(aoStack_1a0," = ");
            v = nonstd::optional_lite::
                optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                ::value((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                         *)local_210);
            ::std::operator<<(poVar3,v);
          }
          nonstd::optional_lite::
          optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
          ::~optional((optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                       *)local_210);
        }
      }
      pAVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
               ::metas((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                        *)name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0," (\n");
        pAVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                 ::metas((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                          *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_230,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_230);
        pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_24,n_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_250);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_250);
        ::std::__cxx11::string::~string((string *)&local_230);
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
            ::has_connections((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                               *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_270,(pprint *)(ulong)local_24,n_01);
      ::std::operator<<(aoStack_1a0,(string *)&local_270);
      ::std::__cxx11::string::~string((string *)&local_270);
      ::std::operator<<(aoStack_1a0,"uniform ");
      value::
      TypeTraits<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
      type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this_00 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                ::get_connections((TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                                   *)name_local);
      sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this_00);
      if (sVar4 == 1) {
        v_00 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_00,0)
        ;
        ::std::operator<<(aoStack_1a0,v_00);
      }
      else {
        sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this_00);
        if (sVar4 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this_00);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    if (attr.metas().authored() || attr.is_blocked() || attr.has_value() || attr.is_value_empty() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (attr.is_value_empty()) {
        // nothing to do
      } else {
        auto pv = attr.get_value();
        if (pv) {
          ss << " = " << pv.value();
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}